

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundostack.cpp
# Opt level: O0

void QUndoStackPrivate::setPrefixedText
               (QAction *action,QString *prefix,QString *defaultText,QString *text)

{
  bool bVar1;
  QString *in_RCX;
  QString *in_RDX;
  QAction *in_RSI;
  undefined8 in_RDI;
  int fieldWidth;
  long in_FS_OFFSET;
  QString s;
  QString *in_stack_ffffffffffffff78;
  QString *in_stack_ffffffffffffff80;
  QChar local_42 [8];
  QChar in_stack_ffffffffffffffce;
  QChar local_22;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  fieldWidth = (int)((ulong)in_RDI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QString::isEmpty((QString *)0xa8322a);
  if (bVar1) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QString::QString(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    bVar1 = QString::isEmpty((QString *)0xa83270);
    if ((!bVar1) && (bVar1 = QString::isEmpty((QString *)0xa8327e), !bVar1)) {
      QChar::QChar<char16_t,_true>(&local_22,L' ');
      QString::append((QChar)(char16_t)&local_20);
    }
    QString::append((QString *)&local_20);
    QAction::setText((QAction *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    QString::~QString((QString *)0xa832c8);
  }
  else {
    bVar1 = QString::isEmpty((QString *)0xa832d7);
    if (bVar1) {
      QAction::setText((QAction *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    else {
      QChar::QChar<char16_t,_true>(local_42,L' ');
      QString::arg<QString,_true>(in_RDX,in_RCX,fieldWidth,in_stack_ffffffffffffffce);
      QAction::setText(in_RSI,in_stack_ffffffffffffff78);
      QString::~QString((QString *)0xa83350);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QUndoStackPrivate::setPrefixedText(QAction *action, const QString &prefix, const QString &defaultText, const QString &text)
{
    if (defaultText.isEmpty()) {
        QString s = prefix;
        if (!prefix.isEmpty() && !text.isEmpty())
            s.append(u' ');
        s.append(text);
        action->setText(s);
    } else {
        if (text.isEmpty())
            action->setText(defaultText);
        else
            action->setText(prefix.arg(text));
    }
}